

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O0

void __thiscall
BipartiteGraph::BipartiteGraph
          (BipartiteGraph *this,
          vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
          *IncidenceMatrix,vector<double,_std::allocator<double>_> *Aweight,
          vector<double,_std::allocator<double>_> *Bweight)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  bool bVar2;
  vector<double,_std::allocator<double>_> *__a;
  pointer pdVar3;
  unsigned_long *__n;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dbl_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  double dbl;
  const_iterator __end1;
  const_iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> *__lhs;
  vector<double,_std::allocator<double>_> *__args;
  vector<Vertex,_std::allocator<Vertex>_> *this_00;
  vector<Vertex,_std::allocator<Vertex>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  vector<double,_std::allocator<double>_> *local_38;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  
  __args = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  ::vector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __a = __args + 1;
  pdVar3 = (pointer)std::vector<double,_std::allocator<double>_>::size(local_18);
  __args[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar3;
  pvVar1 = __args + 1;
  pdVar3 = (pointer)std::vector<double,_std::allocator<double>_>::size(local_20);
  __args[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar3;
  __lhs = __args + 2;
  std::vector<Vertex,_std::allocator<Vertex>_>::vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x153cdc);
  this_00 = (vector<Vertex,_std::allocator<Vertex>_> *)(__args + 3);
  std::vector<Vertex,_std::allocator<Vertex>_>::vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x153cef);
  __n = std::max<unsigned_long>
                  ((unsigned_long *)__a,
                   (unsigned_long *)
                   &(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish);
  in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)*__n;
  std::vector<Vertex,_std::allocator<Vertex>_>::reserve(in_stack_ffffffffffffff90,(size_type)__n);
  std::vector<Vertex,_std::allocator<Vertex>_>::reserve(in_stack_ffffffffffffff90,(size_type)__n);
  local_38 = local_18;
  local_40._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::vector<double,_std::allocator<double>_>::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)__lhs,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_RDI);
    if (!bVar2) break;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator*(&local_40);
    std::vector<Vertex,std::allocator<Vertex>>::emplace_back<double&>(this_00,(double *)__args);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_40);
  }
  local_60._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::vector<double,_std::allocator<double>_>::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)__lhs,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_RDI);
    if (!bVar2) break;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator*(&local_60);
    std::vector<Vertex,std::allocator<Vertex>>::emplace_back<double&>(this_00,(double *)__args);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_60);
  }
  return;
}

Assistant:

BipartiteGraph::BipartiteGraph(vector<deque<bool>>& IncidenceMatrix, const vector<double>& Aweight, const vector<double>& Bweight) : edge(IncidenceMatrix), nA(Aweight.size()), nB(Bweight.size()) {
    this->n = max(nA, nB);
    Avertex.reserve(nA);
    Bvertex.reserve(nB);
    for (auto dbl : Aweight)
        Avertex.emplace_back(dbl);
    for (auto dbl : Bweight)
        Bvertex.emplace_back(dbl);
}